

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  undefined8 *puVar4;
  int iVar5;
  undefined4 uVar6;
  float fVar7;
  undefined4 uVar8;
  Scene *pSVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  AABBNodeMB4D *node1;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  float *vertices_2;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  size_t sVar31;
  ulong uVar32;
  ulong uVar33;
  bool bVar34;
  bool bVar35;
  ulong uVar36;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  UVIdentity<4> mapUV;
  undefined1 local_1508 [16];
  long local_14f8;
  ulong local_14f0;
  NodeRef *local_14e8;
  long local_14e0;
  ulong local_14d8;
  ulong local_14d0;
  RTCFilterFunctionNArguments args;
  undefined8 local_1488;
  undefined8 uStack_1480;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined1 local_1468 [16];
  undefined1 local_1458 [16];
  undefined1 local_1448 [16];
  UVIdentity<4> *local_1438;
  byte local_1430;
  undefined1 local_1428 [16];
  undefined1 local_1418 [16];
  undefined1 local_1408 [16];
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  undefined1 local_13c8 [32];
  undefined1 local_13a8 [32];
  undefined1 local_1388 [32];
  undefined1 local_1368 [32];
  undefined1 local_1348 [32];
  RTCHitN local_1328 [16];
  undefined1 local_1318 [16];
  undefined1 local_1308 [16];
  undefined1 local_12f8 [16];
  undefined1 local_12e8 [16];
  undefined1 local_12d8 [16];
  undefined1 local_12c8 [16];
  uint local_12b8;
  uint uStack_12b4;
  uint uStack_12b0;
  uint uStack_12ac;
  uint uStack_12a8;
  uint uStack_12a4;
  uint uStack_12a0;
  uint uStack_129c;
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  float local_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  float fStack_1240;
  float fStack_123c;
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  float fStack_1220;
  float fStack_121c;
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  float local_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  float fStack_11e8;
  float fStack_11e4;
  float fStack_11e0;
  float fStack_11dc;
  NodeRef stack [564];
  float fVar2;
  float fVar3;
  
  local_14e8 = stack + 1;
  stack[0] = root;
  auVar60 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar73 = ZEXT3264(auVar60);
  auVar60 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar74 = ZEXT3264(auVar60);
  auVar60 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar75 = ZEXT3264(auVar60);
  local_1218 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1238 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1258 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar60 = vbroadcastss_avx512vl(ZEXT416((uint)(local_1218 * 0.99999964)));
  auVar76 = ZEXT3264(auVar60);
  auVar60 = vbroadcastss_avx512vl(ZEXT416((uint)(local_1238 * 0.99999964)));
  auVar77 = ZEXT3264(auVar60);
  local_11f8 = local_1258 * 0.99999964;
  local_1218 = local_1218 * 1.0000004;
  local_1238 = local_1238 * 1.0000004;
  local_1258 = local_1258 * 1.0000004;
  local_14f0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar33 = local_14f0 ^ 0x20;
  iVar5 = (tray->tnear).field_0.i[k];
  auVar69 = ZEXT3264(CONCAT428(iVar5,CONCAT424(iVar5,CONCAT420(iVar5,CONCAT416(iVar5,CONCAT412(iVar5
                                                  ,CONCAT48(iVar5,CONCAT44(iVar5,iVar5))))))));
  iVar5 = (tray->tfar).field_0.i[k];
  auVar71 = ZEXT3264(CONCAT428(iVar5,CONCAT424(iVar5,CONCAT420(iVar5,CONCAT416(iVar5,CONCAT412(iVar5
                                                  ,CONCAT48(iVar5,CONCAT44(iVar5,iVar5))))))));
  auVar15 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  bVar35 = true;
  auVar72 = ZEXT1664(ZEXT816(0) << 0x40);
  fStack_11f4 = local_11f8;
  fStack_11f0 = local_11f8;
  fStack_11ec = local_11f8;
  fStack_11e8 = local_11f8;
  fStack_11e4 = local_11f8;
  fStack_11e0 = local_11f8;
  fStack_11dc = local_11f8;
  fStack_1214 = local_1218;
  fStack_1210 = local_1218;
  fStack_120c = local_1218;
  fStack_1208 = local_1218;
  fStack_1204 = local_1218;
  fStack_1200 = local_1218;
  fStack_11fc = local_1218;
  fStack_1234 = local_1238;
  fStack_1230 = local_1238;
  fStack_122c = local_1238;
  fStack_1228 = local_1238;
  fStack_1224 = local_1238;
  fStack_1220 = local_1238;
  fStack_121c = local_1238;
  fStack_1254 = local_1258;
  fStack_1250 = local_1258;
  fStack_124c = local_1258;
  fStack_1248 = local_1258;
  fStack_1244 = local_1258;
  fStack_1240 = local_1258;
  fStack_123c = local_1258;
  do {
    sVar31 = local_14e8[-1].ptr;
    local_14e8 = local_14e8 + -1;
    while( true ) {
      if ((sVar31 & 8) != 0) break;
      uVar17 = sVar31 & 0xfffffffffffffff0;
      uVar6 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar64._4_4_ = uVar6;
      auVar64._0_4_ = uVar6;
      auVar64._8_4_ = uVar6;
      auVar64._12_4_ = uVar6;
      auVar64._16_4_ = uVar6;
      auVar64._20_4_ = uVar6;
      auVar64._24_4_ = uVar6;
      auVar64._28_4_ = uVar6;
      auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + local_14f0),auVar64,
                                *(undefined1 (*) [32])(uVar17 + 0x40 + local_14f0));
      auVar60 = vsubps_avx512vl(ZEXT1632(auVar48),auVar73._0_32_);
      auVar60 = vmulps_avx512vl(auVar76._0_32_,auVar60);
      auVar60 = vmaxps_avx(auVar69._0_32_,auVar60);
      auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + uVar22),auVar64,
                                *(undefined1 (*) [32])(uVar17 + 0x40 + uVar22));
      auVar61 = vsubps_avx512vl(ZEXT1632(auVar48),auVar74._0_32_);
      auVar62 = vmulps_avx512vl(auVar77._0_32_,auVar61);
      auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + uVar32),auVar64,
                                *(undefined1 (*) [32])(uVar17 + 0x40 + uVar32));
      auVar63 = vsubps_avx512vl(ZEXT1632(auVar48),auVar75._0_32_);
      auVar61._4_4_ = fStack_11f4 * auVar63._4_4_;
      auVar61._0_4_ = local_11f8 * auVar63._0_4_;
      auVar61._8_4_ = fStack_11f0 * auVar63._8_4_;
      auVar61._12_4_ = fStack_11ec * auVar63._12_4_;
      auVar61._16_4_ = fStack_11e8 * auVar63._16_4_;
      auVar61._20_4_ = fStack_11e4 * auVar63._20_4_;
      auVar61._24_4_ = fStack_11e0 * auVar63._24_4_;
      auVar61._28_4_ = auVar63._28_4_;
      auVar61 = vmaxps_avx(auVar62,auVar61);
      auVar60 = vmaxps_avx(auVar60,auVar61);
      auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + uVar33),auVar64,
                                *(undefined1 (*) [32])(uVar17 + 0x40 + uVar33));
      auVar61 = vsubps_avx512vl(ZEXT1632(auVar48),auVar73._0_32_);
      auVar62._4_4_ = fStack_1214 * auVar61._4_4_;
      auVar62._0_4_ = local_1218 * auVar61._0_4_;
      auVar62._8_4_ = fStack_1210 * auVar61._8_4_;
      auVar62._12_4_ = fStack_120c * auVar61._12_4_;
      auVar62._16_4_ = fStack_1208 * auVar61._16_4_;
      auVar62._20_4_ = fStack_1204 * auVar61._20_4_;
      auVar62._24_4_ = fStack_1200 * auVar61._24_4_;
      auVar62._28_4_ = auVar61._28_4_;
      auVar61 = vminps_avx(auVar71._0_32_,auVar62);
      auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + (uVar22 ^ 0x20)),auVar64,
                                *(undefined1 (*) [32])(uVar17 + 0x40 + (uVar22 ^ 0x20)));
      auVar62 = vsubps_avx512vl(ZEXT1632(auVar48),auVar74._0_32_);
      auVar63._4_4_ = fStack_1234 * auVar62._4_4_;
      auVar63._0_4_ = local_1238 * auVar62._0_4_;
      auVar63._8_4_ = fStack_1230 * auVar62._8_4_;
      auVar63._12_4_ = fStack_122c * auVar62._12_4_;
      auVar63._16_4_ = fStack_1228 * auVar62._16_4_;
      auVar63._20_4_ = fStack_1224 * auVar62._20_4_;
      auVar63._24_4_ = fStack_1220 * auVar62._24_4_;
      auVar63._28_4_ = auVar62._28_4_;
      auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + (uVar32 ^ 0x20)),auVar64,
                                *(undefined1 (*) [32])(uVar17 + 0x40 + (uVar32 ^ 0x20)));
      auVar62 = vsubps_avx512vl(ZEXT1632(auVar48),auVar75._0_32_);
      auVar16._4_4_ = fStack_1254 * auVar62._4_4_;
      auVar16._0_4_ = local_1258 * auVar62._0_4_;
      auVar16._8_4_ = fStack_1250 * auVar62._8_4_;
      auVar16._12_4_ = fStack_124c * auVar62._12_4_;
      auVar16._16_4_ = fStack_1248 * auVar62._16_4_;
      auVar16._20_4_ = fStack_1244 * auVar62._20_4_;
      auVar16._24_4_ = fStack_1240 * auVar62._24_4_;
      auVar16._28_4_ = auVar62._28_4_;
      auVar62 = vminps_avx(auVar63,auVar16);
      auVar61 = vminps_avx(auVar61,auVar62);
      if (((uint)sVar31 & 7) == 6) {
        uVar12 = vcmpps_avx512vl(auVar60,auVar61,2);
        uVar13 = vcmpps_avx512vl(auVar64,*(undefined1 (*) [32])(uVar17 + 0x1c0),0xd);
        uVar14 = vcmpps_avx512vl(auVar64,*(undefined1 (*) [32])(uVar17 + 0x1e0),1);
        uVar25 = (uint)uVar12 & (uint)uVar13 & (uint)uVar14;
      }
      else {
        uVar12 = vcmpps_avx512vl(auVar60,auVar61,2);
        uVar25 = (uint)uVar12;
      }
      if ((byte)uVar25 == 0) goto LAB_00792cfb;
      lVar20 = 0;
      for (uVar23 = (ulong)(byte)uVar25; (uVar23 & 1) == 0;
          uVar23 = uVar23 >> 1 | 0x8000000000000000) {
        lVar20 = lVar20 + 1;
      }
      sVar31 = *(size_t *)(uVar17 + lVar20 * 8);
      uVar25 = (uVar25 & 0xff) - 1 & uVar25 & 0xff;
      uVar23 = (ulong)uVar25;
      if (uVar25 != 0) {
        local_14e8->ptr = sVar31;
        lVar20 = 0;
        for (; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
          lVar20 = lVar20 + 1;
        }
        uVar25 = uVar25 - 1 & uVar25;
        uVar23 = (ulong)uVar25;
        bVar34 = uVar25 == 0;
        while( true ) {
          local_14e8 = local_14e8 + 1;
          sVar31 = *(size_t *)(uVar17 + lVar20 * 8);
          if (bVar34) break;
          local_14e8->ptr = sVar31;
          lVar20 = 0;
          for (uVar19 = uVar23; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
            lVar20 = lVar20 + 1;
          }
          uVar23 = uVar23 - 1 & uVar23;
          bVar34 = uVar23 == 0;
        }
      }
    }
    local_14f8 = (ulong)((uint)sVar31 & 0xf) - 8;
    if (local_14f8 != 0) {
      uVar17 = sVar31 & 0xfffffffffffffff0;
      local_14e0 = 0;
      local_1278 = auVar69._0_32_;
      local_1298 = auVar71._0_32_;
      do {
        lVar21 = local_14e0 * 0x50;
        pSVar9 = context->scene;
        pGVar10 = (pSVar9->geometries).items[*(uint *)(uVar17 + 0x30 + lVar21)].ptr;
        fVar7 = (pGVar10->time_range).lower;
        fVar7 = pGVar10->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar7) / ((pGVar10->time_range).upper - fVar7));
        auVar48 = vroundss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7),9);
        auVar48 = vminss_avx(auVar48,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
        auVar66 = vmaxss_avx(auVar72._0_16_,auVar48);
        lVar18 = (long)(int)auVar66._0_4_ * 0x38;
        uVar26 = (ulong)*(uint *)(uVar17 + 4 + lVar21);
        lVar20 = *(long *)(*(long *)&pGVar10[2].numPrimitives + lVar18);
        lVar18 = *(long *)(*(long *)&pGVar10[2].numPrimitives + 0x38 + lVar18);
        auVar48 = *(undefined1 (*) [16])(lVar20 + (ulong)*(uint *)(uVar17 + lVar21) * 4);
        uVar23 = (ulong)*(uint *)(uVar17 + 0x10 + lVar21);
        auVar51 = *(undefined1 (*) [16])(lVar20 + uVar23 * 4);
        uVar19 = (ulong)*(uint *)(uVar17 + 0x20 + lVar21);
        auVar56 = *(undefined1 (*) [16])(lVar20 + uVar19 * 4);
        auVar37 = *(undefined1 (*) [16])(lVar20 + uVar26 * 4);
        local_14d0 = (ulong)*(uint *)(uVar17 + 0x14 + lVar21);
        auVar53 = *(undefined1 (*) [16])(lVar20 + local_14d0 * 4);
        local_14d8 = (ulong)*(uint *)(uVar17 + 0x24 + lVar21);
        auVar54 = *(undefined1 (*) [16])(lVar20 + local_14d8 * 4);
        uVar36 = (ulong)*(uint *)(uVar17 + 8 + lVar21);
        auVar38 = *(undefined1 (*) [16])(lVar20 + uVar36 * 4);
        uVar30 = (ulong)*(uint *)(uVar17 + 0x18 + lVar21);
        auVar40 = *(undefined1 (*) [16])(lVar20 + uVar30 * 4);
        uVar29 = (ulong)*(uint *)(uVar17 + 0x28 + lVar21);
        auVar52 = *(undefined1 (*) [16])(lVar20 + uVar29 * 4);
        uVar28 = (ulong)*(uint *)(uVar17 + 0xc + lVar21);
        auVar49 = *(undefined1 (*) [16])(lVar20 + uVar28 * 4);
        uVar27 = (ulong)*(uint *)(uVar17 + 0x1c + lVar21);
        auVar50 = *(undefined1 (*) [16])(lVar20 + uVar27 * 4);
        uVar24 = (ulong)*(uint *)(uVar17 + 0x2c + lVar21);
        auVar39 = *(undefined1 (*) [16])(lVar20 + uVar24 * 4);
        auVar41 = *(undefined1 (*) [16])(lVar18 + (ulong)*(uint *)(uVar17 + lVar21) * 4);
        auVar42 = *(undefined1 (*) [16])(lVar18 + uVar23 * 4);
        auVar45 = *(undefined1 (*) [16])(lVar18 + uVar19 * 4);
        auVar43 = *(undefined1 (*) [16])(lVar18 + uVar26 * 4);
        auVar44 = *(undefined1 (*) [16])(lVar18 + local_14d0 * 4);
        auVar46 = *(undefined1 (*) [16])(lVar18 + local_14d8 * 4);
        auVar47 = *(undefined1 (*) [16])(lVar18 + uVar36 * 4);
        auVar55 = *(undefined1 (*) [16])(lVar18 + uVar30 * 4);
        auVar57 = *(undefined1 (*) [16])(lVar18 + uVar29 * 4);
        auVar58 = *(undefined1 (*) [16])(lVar18 + uVar28 * 4);
        auVar59 = *(undefined1 (*) [16])(lVar18 + uVar27 * 4);
        auVar65 = *(undefined1 (*) [16])(lVar18 + uVar24 * 4);
        puVar4 = (undefined8 *)(uVar17 + 0x30 + lVar21);
        local_1478 = *puVar4;
        uStack_1470 = puVar4[1];
        puVar4 = (undefined8 *)(uVar17 + 0x40 + lVar21);
        auVar67 = vunpcklps_avx(auVar48,auVar38);
        auVar48 = vunpckhps_avx(auVar48,auVar38);
        auVar38 = vunpcklps_avx(auVar37,auVar49);
        auVar37 = vunpckhps_avx(auVar37,auVar49);
        auVar49 = vunpcklps_avx(auVar48,auVar37);
        auVar68 = vunpcklps_avx(auVar67,auVar38);
        auVar48 = vunpckhps_avx(auVar67,auVar38);
        auVar38 = vunpcklps_avx(auVar51,auVar40);
        auVar51 = vunpckhps_avx(auVar51,auVar40);
        auVar40 = vunpcklps_avx(auVar53,auVar50);
        auVar37 = vunpckhps_avx(auVar53,auVar50);
        auVar53 = vunpcklps_avx(auVar51,auVar37);
        auVar50 = vunpcklps_avx(auVar38,auVar40);
        auVar51 = vunpckhps_avx(auVar38,auVar40);
        auVar38 = vunpcklps_avx(auVar56,auVar52);
        auVar56 = vunpckhps_avx(auVar56,auVar52);
        auVar40 = vunpcklps_avx(auVar54,auVar39);
        auVar37 = vunpckhps_avx(auVar54,auVar39);
        auVar54 = vunpcklps_avx(auVar56,auVar37);
        auVar52 = vunpcklps_avx(auVar38,auVar40);
        auVar56 = vunpckhps_avx(auVar38,auVar40);
        auVar37 = vunpcklps_avx512vl(auVar41,auVar47);
        auVar38 = vunpckhps_avx512vl(auVar41,auVar47);
        auVar39 = vunpcklps_avx512vl(auVar43,auVar58);
        auVar40 = vunpckhps_avx512vl(auVar43,auVar58);
        auVar38 = vunpcklps_avx(auVar38,auVar40);
        auVar40 = vunpcklps_avx(auVar37,auVar39);
        auVar37 = vunpckhps_avx(auVar37,auVar39);
        auVar39 = vunpcklps_avx512vl(auVar42,auVar55);
        auVar41 = vunpckhps_avx512vl(auVar42,auVar55);
        auVar42 = vunpcklps_avx512vl(auVar44,auVar59);
        auVar43 = vunpckhps_avx512vl(auVar44,auVar59);
        auVar41 = vunpcklps_avx512vl(auVar41,auVar43);
        auVar43 = vunpcklps_avx512vl(auVar39,auVar42);
        auVar42 = vunpckhps_avx512vl(auVar39,auVar42);
        auVar44 = vunpcklps_avx512vl(auVar45,auVar57);
        auVar39 = vunpckhps_avx512vl(auVar45,auVar57);
        auVar45 = vunpcklps_avx512vl(auVar46,auVar65);
        auVar46 = vunpckhps_avx512vl(auVar46,auVar65);
        auVar39 = vunpcklps_avx(auVar39,auVar46);
        auVar46 = vunpcklps_avx512vl(auVar44,auVar45);
        auVar45 = vunpckhps_avx512vl(auVar44,auVar45);
        auVar47 = ZEXT416((uint)(fVar7 - auVar66._0_4_));
        auVar44 = vbroadcastss_avx512vl(auVar47);
        auVar47 = vsubss_avx512f(ZEXT416(0x3f800000),auVar47);
        auVar55._0_4_ = auVar47._0_4_;
        auVar55._4_4_ = auVar55._0_4_;
        auVar55._8_4_ = auVar55._0_4_;
        auVar55._12_4_ = auVar55._0_4_;
        auVar40 = vmulps_avx512vl(auVar44,auVar40);
        auVar47 = vmulps_avx512vl(auVar44,auVar37);
        auVar38 = vmulps_avx512vl(auVar44,auVar38);
        auVar37 = vfmadd231ps_fma(auVar40,auVar55,auVar68);
        auVar47 = vfmadd231ps_avx512vl(auVar47,auVar55,auVar48);
        auVar38 = vfmadd231ps_fma(auVar38,auVar55,auVar49);
        auVar48 = vmulps_avx512vl(auVar44,auVar43);
        auVar49 = vmulps_avx512vl(auVar44,auVar42);
        auVar41 = vmulps_avx512vl(auVar44,auVar41);
        auVar40 = vfmadd231ps_fma(auVar48,auVar55,auVar50);
        auVar49 = vfmadd231ps_fma(auVar49,auVar55,auVar51);
        auVar50 = vfmadd231ps_avx512vl(auVar41,auVar55,auVar53);
        auVar48 = vmulps_avx512vl(auVar44,auVar46);
        auVar51 = vmulps_avx512vl(auVar44,auVar45);
        auVar39 = vmulps_avx512vl(auVar44,auVar39);
        auVar53 = vfmadd231ps_fma(auVar48,auVar55,auVar52);
        auVar56 = vfmadd231ps_fma(auVar51,auVar55,auVar56);
        local_1488 = *puVar4;
        uStack_1480 = puVar4[1];
        auVar52 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
        uVar6 = *(undefined4 *)(ray + k * 4);
        auVar45._4_4_ = uVar6;
        auVar45._0_4_ = uVar6;
        auVar45._8_4_ = uVar6;
        auVar45._12_4_ = uVar6;
        auVar41 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
        auVar42 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
        uVar6 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar67._4_4_ = uVar6;
        auVar67._0_4_ = uVar6;
        auVar67._8_4_ = uVar6;
        auVar67._12_4_ = uVar6;
        uVar6 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar68._4_4_ = uVar6;
        auVar68._0_4_ = uVar6;
        auVar68._8_4_ = uVar6;
        auVar68._12_4_ = uVar6;
        auVar54 = vfmadd231ps_fma(auVar39,auVar55,auVar54);
        fVar7 = *(float *)(ray + k * 4 + 0x60);
        auVar70._4_4_ = fVar7;
        auVar70._0_4_ = fVar7;
        auVar70._8_4_ = fVar7;
        auVar70._12_4_ = fVar7;
        auVar48 = vsubps_avx(auVar37,auVar45);
        auVar37 = vsubps_avx512vl(auVar47,auVar41);
        auVar38 = vsubps_avx512vl(auVar38,auVar42);
        auVar51 = vsubps_avx(auVar40,auVar45);
        auVar40 = vsubps_avx512vl(auVar49,auVar41);
        auVar49 = vsubps_avx512vl(auVar50,auVar42);
        auVar53 = vsubps_avx512vl(auVar53,auVar45);
        auVar50 = vsubps_avx512vl(auVar56,auVar41);
        auVar54 = vsubps_avx512vl(auVar54,auVar42);
        auVar39 = vsubps_avx512vl(auVar53,auVar48);
        auVar41 = vsubps_avx512vl(auVar50,auVar37);
        auVar42 = vsubps_avx512vl(auVar54,auVar38);
        auVar45 = vsubps_avx512vl(auVar48,auVar51);
        auVar43 = vsubps_avx512vl(auVar37,auVar40);
        auVar44 = vsubps_avx512vl(auVar38,auVar49);
        auVar46 = vsubps_avx512vl(auVar51,auVar53);
        auVar47 = vsubps_avx512vl(auVar40,auVar50);
        auVar55 = vsubps_avx512vl(auVar49,auVar54);
        auVar56 = vaddps_avx512vl(auVar53,auVar48);
        auVar57 = vaddps_avx512vl(auVar50,auVar37);
        auVar58 = vaddps_avx512vl(auVar54,auVar38);
        auVar59 = vmulps_avx512vl(auVar57,auVar42);
        auVar59 = vfmsub231ps_avx512vl(auVar59,auVar41,auVar58);
        auVar58 = vmulps_avx512vl(auVar58,auVar39);
        auVar58 = vfmsub231ps_avx512vl(auVar58,auVar42,auVar56);
        auVar65._0_4_ = auVar41._0_4_ * auVar56._0_4_;
        auVar65._4_4_ = auVar41._4_4_ * auVar56._4_4_;
        auVar65._8_4_ = auVar41._8_4_ * auVar56._8_4_;
        auVar65._12_4_ = auVar41._12_4_ * auVar56._12_4_;
        auVar56 = vfmsub231ps_fma(auVar65,auVar39,auVar57);
        auVar57._0_4_ = fVar7 * auVar56._0_4_;
        auVar57._4_4_ = fVar7 * auVar56._4_4_;
        auVar57._8_4_ = fVar7 * auVar56._8_4_;
        auVar57._12_4_ = fVar7 * auVar56._12_4_;
        auVar56 = vfmadd231ps_avx512vl(auVar57,auVar68,auVar58);
        local_1468 = vfmadd231ps_avx512vl(auVar56,auVar67,auVar59);
        auVar59._0_4_ = auVar51._0_4_ + auVar48._0_4_;
        auVar59._4_4_ = auVar51._4_4_ + auVar48._4_4_;
        auVar59._8_4_ = auVar51._8_4_ + auVar48._8_4_;
        auVar59._12_4_ = auVar51._12_4_ + auVar48._12_4_;
        auVar56 = vaddps_avx512vl(auVar37,auVar40);
        auVar57 = vaddps_avx512vl(auVar38,auVar49);
        auVar58 = vmulps_avx512vl(auVar56,auVar44);
        auVar58 = vfmsub231ps_avx512vl(auVar58,auVar43,auVar57);
        auVar57 = vmulps_avx512vl(auVar57,auVar45);
        auVar57 = vfmsub231ps_avx512vl(auVar57,auVar44,auVar59);
        auVar59 = vmulps_avx512vl(auVar59,auVar43);
        auVar56 = vfmsub231ps_avx512vl(auVar59,auVar45,auVar56);
        auVar66._0_4_ = fVar7 * auVar56._0_4_;
        auVar66._4_4_ = fVar7 * auVar56._4_4_;
        auVar66._8_4_ = fVar7 * auVar56._8_4_;
        auVar66._12_4_ = fVar7 * auVar56._12_4_;
        auVar56 = vfmadd231ps_avx512vl(auVar66,auVar68,auVar57);
        local_1458 = vfmadd231ps_avx512vl(auVar56,auVar67,auVar58);
        auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar51 = vaddps_avx512vl(auVar51,auVar53);
        auVar53 = vaddps_avx512vl(auVar40,auVar50);
        auVar54 = vaddps_avx512vl(auVar49,auVar54);
        auVar40 = vmulps_avx512vl(auVar53,auVar55);
        auVar40 = vfmsub231ps_avx512vl(auVar40,auVar47,auVar54);
        auVar54 = vmulps_avx512vl(auVar54,auVar46);
        auVar54 = vfmsub231ps_avx512vl(auVar54,auVar55,auVar51);
        auVar49._0_4_ = auVar51._0_4_ * auVar47._0_4_;
        auVar49._4_4_ = auVar51._4_4_ * auVar47._4_4_;
        auVar49._8_4_ = auVar51._8_4_ * auVar47._8_4_;
        auVar49._12_4_ = auVar51._12_4_ * auVar47._12_4_;
        auVar51 = vfmsub231ps_fma(auVar49,auVar46,auVar53);
        auVar51 = vmulps_avx512vl(auVar51,auVar70);
        auVar51 = vfmadd231ps_avx512vl(auVar51,auVar68,auVar54);
        auVar51 = vfmadd231ps_avx512vl(auVar51,auVar67,auVar40);
        auVar53._0_4_ = local_1468._0_4_ + local_1458._0_4_;
        auVar53._4_4_ = local_1468._4_4_ + local_1458._4_4_;
        auVar53._8_4_ = local_1468._8_4_ + local_1458._8_4_;
        auVar53._12_4_ = local_1468._12_4_ + local_1458._12_4_;
        local_1448 = vaddps_avx512vl(auVar51,auVar53);
        auVar53 = vandps_avx512vl(local_1448,auVar56);
        auVar54 = vmulps_avx512vl(auVar53,auVar52);
        auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar52 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar49 = vminps_avx512vl(local_1468,local_1458);
        auVar49 = vminps_avx512vl(auVar49,auVar51);
        auVar52 = vxorps_avx512vl(auVar54,auVar52);
        uVar12 = vcmpps_avx512vl(auVar49,auVar52,5);
        auVar52 = vmaxps_avx512vl(local_1468,local_1458);
        auVar51 = vmaxps_avx512vl(auVar52,auVar51);
        uVar13 = vcmpps_avx512vl(auVar51,auVar54,2);
        local_1430 = ((byte)uVar12 | (byte)uVar13) & 0xf;
        if (local_1430 != 0) {
          auVar51 = vmulps_avx512vl(auVar43,auVar42);
          auVar54 = vmulps_avx512vl(auVar39,auVar44);
          auVar52 = vmulps_avx512vl(auVar45,auVar41);
          auVar49 = vmulps_avx512vl(auVar47,auVar44);
          auVar50 = vmulps_avx512vl(auVar45,auVar55);
          auVar57 = vmulps_avx512vl(auVar46,auVar43);
          auVar41 = vfmsub213ps_avx512vl(auVar41,auVar44,auVar51);
          auVar42 = vfmsub213ps_avx512vl(auVar42,auVar45,auVar54);
          auVar39 = vfmsub213ps_avx512vl(auVar39,auVar43,auVar52);
          auVar43 = vfmsub213ps_avx512vl(auVar55,auVar43,auVar49);
          auVar44 = vfmsub213ps_avx512vl(auVar46,auVar44,auVar50);
          auVar45 = vfmsub213ps_avx512vl(auVar47,auVar45,auVar57);
          auVar51 = vandps_avx512vl(auVar51,auVar56);
          auVar49 = vandps_avx512vl(auVar49,auVar56);
          uVar23 = vcmpps_avx512vl(auVar51,auVar49,1);
          auVar51 = vandps_avx512vl(auVar54,auVar56);
          auVar54 = vandps_avx512vl(auVar50,auVar56);
          uVar19 = vcmpps_avx512vl(auVar51,auVar54,1);
          auVar51 = vandps_avx512vl(auVar52,auVar56);
          auVar56 = vandps_avx512vl(auVar57,auVar56);
          uVar36 = vcmpps_avx512vl(auVar51,auVar56,1);
          bVar34 = (bool)((byte)uVar23 & 1);
          local_13f8._0_4_ = (uint)bVar34 * auVar41._0_4_ | (uint)!bVar34 * auVar43._0_4_;
          bVar34 = (bool)((byte)(uVar23 >> 1) & 1);
          local_13f8._4_4_ = (uint)bVar34 * auVar41._4_4_ | (uint)!bVar34 * auVar43._4_4_;
          bVar34 = (bool)((byte)(uVar23 >> 2) & 1);
          local_13f8._8_4_ = (uint)bVar34 * auVar41._8_4_ | (uint)!bVar34 * auVar43._8_4_;
          bVar34 = (bool)((byte)(uVar23 >> 3) & 1);
          local_13f8._12_4_ = (uint)bVar34 * auVar41._12_4_ | (uint)!bVar34 * auVar43._12_4_;
          bVar34 = (bool)((byte)uVar19 & 1);
          local_13e8._0_4_ = (uint)bVar34 * auVar42._0_4_ | (uint)!bVar34 * auVar44._0_4_;
          bVar34 = (bool)((byte)(uVar19 >> 1) & 1);
          local_13e8._4_4_ = (uint)bVar34 * auVar42._4_4_ | (uint)!bVar34 * auVar44._4_4_;
          bVar34 = (bool)((byte)(uVar19 >> 2) & 1);
          local_13e8._8_4_ = (uint)bVar34 * auVar42._8_4_ | (uint)!bVar34 * auVar44._8_4_;
          bVar34 = (bool)((byte)(uVar19 >> 3) & 1);
          local_13e8._12_4_ = (uint)bVar34 * auVar42._12_4_ | (uint)!bVar34 * auVar44._12_4_;
          bVar34 = (bool)((byte)uVar36 & 1);
          local_13d8._0_4_ = (float)((uint)bVar34 * auVar39._0_4_ | (uint)!bVar34 * auVar45._0_4_);
          bVar34 = (bool)((byte)(uVar36 >> 1) & 1);
          local_13d8._4_4_ = (float)((uint)bVar34 * auVar39._4_4_ | (uint)!bVar34 * auVar45._4_4_);
          bVar34 = (bool)((byte)(uVar36 >> 2) & 1);
          local_13d8._8_4_ = (float)((uint)bVar34 * auVar39._8_4_ | (uint)!bVar34 * auVar45._8_4_);
          bVar34 = (bool)((byte)(uVar36 >> 3) & 1);
          local_13d8._12_4_ =
               (float)((uint)bVar34 * auVar39._12_4_ | (uint)!bVar34 * auVar45._12_4_);
          auVar52._0_4_ = fVar7 * local_13d8._0_4_;
          auVar52._4_4_ = fVar7 * local_13d8._4_4_;
          auVar52._8_4_ = fVar7 * local_13d8._8_4_;
          auVar52._12_4_ = fVar7 * local_13d8._12_4_;
          auVar51 = vfmadd213ps_fma(auVar68,local_13e8,auVar52);
          auVar51 = vfmadd213ps_fma(auVar67,local_13f8,auVar51);
          auVar54._0_4_ = auVar51._0_4_ + auVar51._0_4_;
          auVar54._4_4_ = auVar51._4_4_ + auVar51._4_4_;
          auVar54._8_4_ = auVar51._8_4_ + auVar51._8_4_;
          auVar54._12_4_ = auVar51._12_4_ + auVar51._12_4_;
          auVar51._0_4_ = auVar38._0_4_ * local_13d8._0_4_;
          auVar51._4_4_ = auVar38._4_4_ * local_13d8._4_4_;
          auVar51._8_4_ = auVar38._8_4_ * local_13d8._8_4_;
          auVar51._12_4_ = auVar38._12_4_ * local_13d8._12_4_;
          auVar51 = vfmadd213ps_fma(auVar37,local_13e8,auVar51);
          auVar51 = vfmadd213ps_fma(auVar48,local_13f8,auVar51);
          auVar48 = vrcp14ps_avx512vl(auVar54);
          auVar56 = vfnmadd213ps_avx512vl(auVar48,auVar54,auVar40);
          auVar48 = vfmadd132ps_fma(auVar56,auVar48,auVar48);
          uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar56._4_4_ = uVar6;
          auVar56._0_4_ = uVar6;
          auVar56._8_4_ = uVar6;
          auVar56._12_4_ = uVar6;
          auVar69 = ZEXT1664(auVar56);
          local_1408._0_4_ = auVar48._0_4_ * (auVar51._0_4_ + auVar51._0_4_);
          local_1408._4_4_ = auVar48._4_4_ * (auVar51._4_4_ + auVar51._4_4_);
          local_1408._8_4_ = auVar48._8_4_ * (auVar51._8_4_ + auVar51._8_4_);
          local_1408._12_4_ = auVar48._12_4_ * (auVar51._12_4_ + auVar51._12_4_);
          uVar12 = vcmpps_avx512vl(local_1408,auVar56,2);
          uVar6 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar48._4_4_ = uVar6;
          auVar48._0_4_ = uVar6;
          auVar48._8_4_ = uVar6;
          auVar48._12_4_ = uVar6;
          uVar13 = vcmpps_avx512vl(local_1408,auVar48,0xd);
          local_1430 = (byte)uVar12 & (byte)uVar13 & local_1430;
          if (local_1430 != 0) {
            uVar12 = vcmpps_avx512vl(auVar54,_DAT_01f7aa10,4);
            local_1430 = local_1430 & (byte)uVar12;
            if (local_1430 != 0) {
              auVar37._8_4_ = 0x219392ef;
              auVar37._0_8_ = 0x219392ef219392ef;
              auVar37._12_4_ = 0x219392ef;
              uVar23 = vcmpps_avx512vl(auVar53,auVar37,5);
              auVar48 = vrcp14ps_avx512vl(local_1448);
              auVar51 = vfnmadd213ps_avx512vl(local_1448,auVar48,auVar40);
              auVar48 = vfmadd132ps_avx512vl(auVar51,auVar48,auVar48);
              fVar1 = (float)((uint)((byte)uVar23 & 1) * auVar48._0_4_);
              fVar2 = (float)((uint)((byte)(uVar23 >> 1) & 1) * auVar48._4_4_);
              fVar3 = (float)((uint)((byte)(uVar23 >> 2) & 1) * auVar48._8_4_);
              fVar7 = (float)((uint)((byte)(uVar23 >> 3) & 1) * auVar48._12_4_);
              local_1438 = &mapUV;
              auVar38._0_4_ = fVar1 * local_1468._0_4_;
              auVar38._4_4_ = fVar2 * local_1468._4_4_;
              auVar38._8_4_ = fVar3 * local_1468._8_4_;
              auVar38._12_4_ = fVar7 * local_1468._12_4_;
              local_1428 = vminps_avx512vl(auVar38,auVar40);
              auVar50._0_4_ = fVar1 * local_1458._0_4_;
              auVar50._4_4_ = fVar2 * local_1458._4_4_;
              auVar50._8_4_ = fVar3 * local_1458._8_4_;
              auVar50._12_4_ = fVar7 * local_1458._12_4_;
              local_1418 = vminps_avx512vl(auVar50,auVar40);
              uVar23 = (ulong)local_1430;
              do {
                uVar19 = 0;
                for (uVar36 = uVar23; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000)
                {
                  uVar19 = uVar19 + 1;
                }
                pGVar10 = (pSVar9->geometries).items[*(uint *)((long)&local_1478 + uVar19 * 4)].ptr;
                if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00792d11:
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    return bVar35;
                  }
                  uVar36 = (ulong)(uint)((int)uVar19 * 4);
                  uVar6 = *(undefined4 *)(local_1428 + uVar36);
                  local_12f8._4_4_ = uVar6;
                  local_12f8._0_4_ = uVar6;
                  local_12f8._8_4_ = uVar6;
                  local_12f8._12_4_ = uVar6;
                  uVar6 = *(undefined4 *)(local_1418 + uVar36);
                  local_12e8._4_4_ = uVar6;
                  local_12e8._0_4_ = uVar6;
                  local_12e8._8_4_ = uVar6;
                  local_12e8._12_4_ = uVar6;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1408 + uVar36);
                  args.context = context->user;
                  local_12c8 = vpbroadcastd_avx512vl();
                  uVar6 = *(undefined4 *)((long)&local_1488 + uVar36);
                  local_12d8._4_4_ = uVar6;
                  local_12d8._0_4_ = uVar6;
                  local_12d8._8_4_ = uVar6;
                  local_12d8._12_4_ = uVar6;
                  uVar6 = *(undefined4 *)(local_13f8 + uVar36);
                  uVar8 = *(undefined4 *)(local_13e8 + uVar36);
                  local_1318._4_4_ = uVar8;
                  local_1318._0_4_ = uVar8;
                  local_1318._8_4_ = uVar8;
                  local_1318._12_4_ = uVar8;
                  uVar8 = *(undefined4 *)(local_13d8 + uVar36);
                  local_1308._4_4_ = uVar8;
                  local_1308._0_4_ = uVar8;
                  local_1308._8_4_ = uVar8;
                  local_1308._12_4_ = uVar8;
                  local_1328[0] = (RTCHitN)(char)uVar6;
                  local_1328[1] = (RTCHitN)(char)((uint)uVar6 >> 8);
                  local_1328[2] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
                  local_1328[3] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
                  local_1328[4] = (RTCHitN)(char)uVar6;
                  local_1328[5] = (RTCHitN)(char)((uint)uVar6 >> 8);
                  local_1328[6] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
                  local_1328[7] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
                  local_1328[8] = (RTCHitN)(char)uVar6;
                  local_1328[9] = (RTCHitN)(char)((uint)uVar6 >> 8);
                  local_1328[10] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
                  local_1328[0xb] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
                  local_1328[0xc] = (RTCHitN)(char)uVar6;
                  local_1328[0xd] = (RTCHitN)(char)((uint)uVar6 >> 8);
                  local_1328[0xe] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
                  local_1328[0xf] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
                  vpcmpeqd_avx2(ZEXT1632(local_12c8),ZEXT1632(local_12c8));
                  uStack_12b4 = (args.context)->instID[0];
                  local_12b8 = uStack_12b4;
                  uStack_12b0 = uStack_12b4;
                  uStack_12ac = uStack_12b4;
                  uStack_12a8 = (args.context)->instPrimID[0];
                  uStack_12a4 = uStack_12a8;
                  uStack_12a0 = uStack_12a8;
                  uStack_129c = uStack_12a8;
                  args.valid = (int *)local_1508;
                  args.geometryUserPtr = pGVar10->userPtr;
                  args.hit = local_1328;
                  args.N = 4;
                  local_1348 = auVar73._0_32_;
                  local_1368 = auVar74._0_32_;
                  local_1388 = auVar75._0_32_;
                  local_13a8 = auVar76._0_32_;
                  local_13c8 = auVar77._0_32_;
                  auVar48 = auVar69._0_16_;
                  local_1508 = auVar15;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar10->occlusionFilterN)(&args);
                    auVar69 = ZEXT1664(auVar48);
                    auVar77 = ZEXT3264(local_13c8);
                    auVar76 = ZEXT3264(local_13a8);
                    auVar75 = ZEXT3264(local_1388);
                    auVar74 = ZEXT3264(local_1368);
                    auVar73 = ZEXT3264(local_1348);
                  }
                  uVar36 = vptestmd_avx512vl(local_1508,local_1508);
                  if ((uVar36 & 0xf) != 0) {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var11)(&args);
                      auVar69 = ZEXT1664(auVar48);
                      auVar77 = ZEXT3264(local_13c8);
                      auVar76 = ZEXT3264(local_13a8);
                      auVar75 = ZEXT3264(local_1388);
                      auVar74 = ZEXT3264(local_1368);
                      auVar73 = ZEXT3264(local_1348);
                    }
                    auVar48 = *(undefined1 (*) [16])(args.ray + 0x80);
                    uVar36 = vptestmd_avx512vl(local_1508,local_1508);
                    uVar36 = uVar36 & 0xf;
                    auVar51 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar34 = (bool)((byte)uVar36 & 1);
                    auVar40._0_4_ = (uint)bVar34 * auVar51._0_4_ | (uint)!bVar34 * auVar48._0_4_;
                    bVar34 = (bool)((byte)(uVar36 >> 1) & 1);
                    auVar40._4_4_ = (uint)bVar34 * auVar51._4_4_ | (uint)!bVar34 * auVar48._4_4_;
                    bVar34 = (bool)((byte)(uVar36 >> 2) & 1);
                    auVar40._8_4_ = (uint)bVar34 * auVar51._8_4_ | (uint)!bVar34 * auVar48._8_4_;
                    bVar34 = SUB81(uVar36 >> 3,0);
                    auVar40._12_4_ = (uint)bVar34 * auVar51._12_4_ | (uint)!bVar34 * auVar48._12_4_;
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar40;
                    if ((byte)uVar36 != 0) goto LAB_00792d11;
                  }
                  *(int *)(ray + k * 4 + 0x80) = auVar69._0_4_;
                }
                uVar23 = uVar23 ^ 1L << (uVar19 & 0x3f);
              } while (uVar23 != 0);
            }
          }
        }
        local_14e0 = local_14e0 + 1;
        auVar69 = ZEXT3264(local_1278);
        auVar71 = ZEXT3264(local_1298);
        auVar72 = ZEXT1664(ZEXT816(0) << 0x40);
      } while (local_14e0 != local_14f8);
    }
LAB_00792cfb:
    bVar35 = local_14e8 != stack;
    if (!bVar35) {
      return bVar35;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }